

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t parse_file_extra_hash(archive_read *a,rar5 *rar,ssize_t *extra_data_size)

{
  wchar_t wVar1;
  uint8_t *puStack_40;
  wchar_t hash_size;
  uint8_t *p;
  size_t value_len;
  size_t hash_type;
  ssize_t *extra_data_size_local;
  rar5 *rar_local;
  archive_read *a_local;
  
  value_len = 0;
  hash_type = (size_t)extra_data_size;
  extra_data_size_local = (ssize_t *)rar;
  rar_local = (rar5 *)a;
  wVar1 = read_var_sized(a,&value_len,(size_t *)&p);
  if (wVar1 == L'\0') {
    a_local._4_4_ = L'\x01';
  }
  else {
    *(long *)hash_type = *(long *)hash_type - (long)p;
    wVar1 = consume((archive_read *)rar_local,(int64_t)p);
    if (wVar1 == L'\0') {
      if (value_len == 0) {
        wVar1 = read_ahead((archive_read *)rar_local,0x20,&stack0xffffffffffffffc0);
        if (wVar1 == L'\0') {
          a_local._4_4_ = L'\x01';
        }
        else {
          *(undefined1 *)(extra_data_size_local + 0xa5e) = 1;
          *(undefined8 *)((long)extra_data_size_local + 0x4bf4) = *(undefined8 *)puStack_40;
          *(undefined8 *)((long)extra_data_size_local + 0x4bfc) = *(undefined8 *)(puStack_40 + 8);
          *(undefined8 *)((long)extra_data_size_local + 0x4c04) = *(undefined8 *)(puStack_40 + 0x10)
          ;
          *(undefined8 *)((long)extra_data_size_local + 0x4c0c) = *(undefined8 *)(puStack_40 + 0x18)
          ;
          wVar1 = consume((archive_read *)rar_local,0x20);
          if (wVar1 == L'\0') {
            *(long *)hash_type = *(long *)hash_type + -0x20;
            a_local._4_4_ = L'\0';
          }
          else {
            a_local._4_4_ = L'\x01';
          }
        }
      }
      else {
        archive_set_error((archive *)rar_local,0x54,"Unsupported hash type (0x%x)",
                          value_len & 0xffffffff);
        a_local._4_4_ = L'\xffffffe2';
      }
    }
    else {
      a_local._4_4_ = L'\x01';
    }
  }
  return a_local._4_4_;
}

Assistant:

static int parse_file_extra_hash(struct archive_read* a, struct rar5* rar,
    ssize_t* extra_data_size)
{
	size_t hash_type = 0;
	size_t value_len;

	enum HASH_TYPE {
		BLAKE2sp = 0x00
	};

	if(!read_var_sized(a, &hash_type, &value_len))
		return ARCHIVE_EOF;

	*extra_data_size -= value_len;
	if(ARCHIVE_OK != consume(a, value_len)) {
		return ARCHIVE_EOF;
	}

	/* The file uses BLAKE2sp checksum algorithm instead of plain old
	 * CRC32. */
	if(hash_type == BLAKE2sp) {
		const uint8_t* p;
		const int hash_size = sizeof(rar->file.blake2sp);

		if(!read_ahead(a, hash_size, &p))
			return ARCHIVE_EOF;

		rar->file.has_blake2 = 1;
		memcpy(&rar->file.blake2sp, p, hash_size);

		if(ARCHIVE_OK != consume(a, hash_size)) {
			return ARCHIVE_EOF;
		}

		*extra_data_size -= hash_size;
	} else {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Unsupported hash type (0x%x)", (int) hash_type);
		return ARCHIVE_FATAL;
	}

	return ARCHIVE_OK;
}